

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<kj::HttpClient::WebSocketResponse> __thiscall
kj::anon_unknown_36::PromiseNetworkAddressHttpClient::openWebSocket
          (PromiseNetworkAddressHttpClient *this,StringPtr url,HttpHeaders *headers)

{
  long lVar1;
  undefined8 uVar2;
  PromiseArena *pPVar3;
  OwnPromiseNode node;
  void *pvVar4;
  int __flags;
  void *extraout_RDX;
  void *extraout_RDX_00;
  Event *pEVar6;
  PromiseArena *pPVar7;
  __fn *in_R8;
  __fn *__arg;
  undefined1 *__n;
  TransformPromiseNodeBase *this_00;
  StringPtr url_00;
  String urlCopy;
  HttpHeaders headersCopy;
  undefined1 local_150 [16];
  PromiseArena *pPStack_140;
  EventLoop *pEStack_138;
  Event *local_130;
  PromiseArena *local_128;
  PromiseArena *pPStack_120;
  EventLoop *pEStack_118;
  undefined1 local_110 [96];
  OwnPromiseNode local_b0;
  HttpHeaders local_a8;
  PromiseDisposer local_48 [8];
  SourceLocation local_40;
  HttpHeaders *pHVar5;
  
  url_00.content.size_ = (void *)url.content.size_;
  pEVar6 = (Event *)url.content.ptr;
  lVar1._0_1_ = pEVar6->firing;
  lVar1._1_3_ = *(undefined3 *)&pEVar6->field_0x21;
  lVar1._4_4_ = pEVar6->live;
  if (lVar1 == 0) {
    pHVar5 = headers;
    __arg = in_R8;
    heapString((String *)(local_150 + 8),
               (size_t)((long)&headers[-1].ownedStrings.builder.disposer + 7));
    __flags = (int)pHVar5;
    __n = (undefined1 *)((long)&headers[-1].ownedStrings.builder.disposer + 7);
    pvVar4 = extraout_RDX;
    if (__n != (undefined1 *)0x0) {
      pPVar7 = pPStack_140;
      if (pPStack_140 != (PromiseArena *)0x0) {
        pPVar7 = (PromiseArena *)local_150._8_8_;
      }
      memcpy(pPVar7,url_00.content.size_,(size_t)__n);
      pvVar4 = extraout_RDX_00;
    }
    HttpHeaders::clone(&local_a8,in_R8,pvVar4,__flags,__arg);
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_150);
    uVar2 = local_150._0_8_;
    local_128 = (PromiseArena *)local_150._8_8_;
    pPStack_120 = pPStack_140;
    pEStack_118 = pEStack_138;
    local_150._8_8_ = (PromiseArena *)0x0;
    pPStack_140 = (PromiseArena *)0x0;
    local_110._0_8_ = local_a8.table;
    local_110._8_8_ = local_a8.indexedHeaders.ptr;
    local_110._16_8_ = local_a8.indexedHeaders.size_;
    local_110._24_8_ = local_a8.indexedHeaders.disposer;
    local_110._32_8_ = local_a8.unindexedHeaders.builder.ptr;
    local_a8.indexedHeaders.ptr = (StringPtr *)0x0;
    local_a8.indexedHeaders.size_ = 0;
    local_110._40_8_ = local_a8.unindexedHeaders.builder.pos;
    local_110._48_8_ = local_a8.unindexedHeaders.builder.endPtr;
    local_110._56_8_ = local_a8.unindexedHeaders.builder.disposer;
    local_a8.unindexedHeaders.builder.ptr = (Header *)0x0;
    local_a8.unindexedHeaders.builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
    local_a8.unindexedHeaders.builder.endPtr = (Header *)0x0;
    local_110._64_8_ = local_a8.ownedStrings.builder.ptr;
    local_110._72_8_ = local_a8.ownedStrings.builder.pos;
    local_110._80_8_ = local_a8.ownedStrings.builder.endPtr;
    local_110._88_8_ = local_a8.ownedStrings.builder.disposer;
    local_a8.ownedStrings.builder.ptr = (Array<char> *)0x0;
    local_a8.ownedStrings.builder.pos = (RemoveConst<kj::Array<char>_> *)0x0;
    local_a8.ownedStrings.builder.endPtr = (Array<char> *)0x0;
    pPVar7 = ((PromiseArenaMember *)local_150._0_8_)->arena;
    local_130 = pEVar6;
    if (pPVar7 == (PromiseArena *)0x0 || (ulong)(local_150._0_8_ - (long)pPVar7) < 0xa0) {
      pvVar4 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x360);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)local_150,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6241:11)>
                 ::anon_class_128_3_9f8f6369_for_func::operator());
      *(undefined ***)((long)pvVar4 + 0x360) = &PTR_destroy_00640700;
      *(Event **)((long)pvVar4 + 0x380) = local_130;
      *(PromiseArena **)((long)pvVar4 + 0x388) = local_128;
      *(PromiseArena **)((long)pvVar4 + 0x390) = pPStack_120;
      *(EventLoop **)((long)pvVar4 + 0x398) = pEStack_118;
      *(undefined8 *)((long)pvVar4 + 0x3a0) = local_110._0_8_;
      *(undefined8 *)((long)pvVar4 + 0x3a8) = local_110._8_8_;
      *(undefined8 *)((long)pvVar4 + 0x3b0) = local_110._16_8_;
      *(undefined8 *)((long)pvVar4 + 0x3b8) = local_110._24_8_;
      *(undefined8 *)((long)pvVar4 + 0x3c0) = local_110._32_8_;
      *(undefined8 *)((long)pvVar4 + 0x3c8) = local_110._40_8_;
      *(undefined8 *)((long)pvVar4 + 0x3d0) = local_110._48_8_;
      *(undefined8 *)((long)pvVar4 + 0x3d8) = local_110._56_8_;
      *(undefined8 *)((long)pvVar4 + 0x3e0) = local_110._64_8_;
      *(undefined8 *)((long)pvVar4 + 1000) = local_110._72_8_;
      *(undefined8 *)((long)pvVar4 + 0x3f0) = local_110._80_8_;
      *(undefined8 *)((long)pvVar4 + 0x3f8) = local_110._88_8_;
      *(void **)((long)pvVar4 + 0x368) = pvVar4;
    }
    else {
      ((PromiseArenaMember *)local_150._0_8_)->arena = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)(local_150._0_8_ + -0xa0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)local_150,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:6241:11)>
                 ::anon_class_128_3_9f8f6369_for_func::operator());
      ((PromiseArenaMember *)(uVar2 + -0xa0))->_vptr_PromiseArenaMember =
           (_func_int **)&PTR_destroy_00640700;
      ((PromiseArenaMember *)(uVar2 + -0x80))->_vptr_PromiseArenaMember = (_func_int **)local_130;
      ((PromiseArenaMember *)(uVar2 + -0x80))->arena = local_128;
      ((PromiseArenaMember *)(uVar2 + -0x70))->_vptr_PromiseArenaMember = (_func_int **)pPStack_120;
      ((PromiseArenaMember *)(uVar2 + -0x70))->arena = (PromiseArena *)pEStack_118;
      ((PromiseArenaMember *)(uVar2 + -0x60))->_vptr_PromiseArenaMember =
           (_func_int **)local_110._0_8_;
      ((PromiseArenaMember *)(uVar2 + -0x60))->arena = (PromiseArena *)local_110._8_8_;
      ((PromiseArenaMember *)(uVar2 + -0x50))->_vptr_PromiseArenaMember =
           (_func_int **)local_110._16_8_;
      ((PromiseArenaMember *)(uVar2 + -0x50))->arena = (PromiseArena *)local_110._24_8_;
      ((PromiseArenaMember *)(uVar2 + -0x40))->_vptr_PromiseArenaMember =
           (_func_int **)local_110._32_8_;
      ((PromiseArenaMember *)(uVar2 + -0x40))->arena = (PromiseArena *)local_110._40_8_;
      ((PromiseArenaMember *)(uVar2 + -0x30))->_vptr_PromiseArenaMember =
           (_func_int **)local_110._48_8_;
      ((PromiseArenaMember *)(uVar2 + -0x30))->arena = (PromiseArena *)local_110._56_8_;
      ((PromiseArenaMember *)(uVar2 + -0x20))->_vptr_PromiseArenaMember =
           (_func_int **)local_110._64_8_;
      ((PromiseArenaMember *)(uVar2 + -0x20))->arena = (PromiseArena *)local_110._72_8_;
      ((PromiseArenaMember *)(uVar2 + -0x10))->_vptr_PromiseArenaMember =
           (_func_int **)local_110._80_8_;
      ((PromiseArenaMember *)(uVar2 + -0x10))->arena = (PromiseArena *)local_110._88_8_;
      ((PromiseArenaMember *)(uVar2 + -0xa0))->arena = pPVar7;
    }
    local_110._80_8_ = (ArrayDisposer *)0x0;
    local_110._72_8_ = 0;
    local_110._64_8_ = (char *)0x0;
    local_110._48_8_ = (Header *)0x0;
    local_110._40_8_ = (ForkBranchBase *)0x0;
    local_110._32_8_ = (Header *)0x0;
    local_110._16_8_ = 0;
    local_110._8_8_ = (StringPtr *)0x0;
    pPStack_120 = (PromiseArena *)0x0;
    local_128 = (PromiseArena *)0x0;
    local_40.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
    ;
    local_40.function = "then";
    local_40._16_8_ = &DAT_4c0000058b;
    local_b0.ptr = &this_00->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              (local_48,&local_b0,&local_40);
    node.ptr = (PromiseNode *)local_b0;
    (this->super_HttpClient)._vptr_HttpClient = (_func_int **)local_48;
    if ((TransformPromiseNodeBase *)local_b0.ptr != (TransformPromiseNodeBase *)0x0) {
      local_b0.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
    }
    HttpHeaders::~HttpHeaders((HttpHeaders *)local_110);
    pPVar3 = pPStack_120;
    pPVar7 = local_128;
    if (local_128 != (PromiseArena *)0x0) {
      local_128 = (PromiseArena *)0x0;
      pPStack_120 = (PromiseArena *)0x0;
      (*(code *)((pEStack_118->port).ptr)->_vptr_EventPort)(pEStack_118,pPVar7,1,pPVar3,pPVar3,0);
    }
    uVar2 = local_150._0_8_;
    if ((PromiseArenaMember *)local_150._0_8_ != (PromiseArenaMember *)0x0) {
      local_150._0_8_ = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
    }
    HttpHeaders::~HttpHeaders(&local_a8);
    pPVar7 = pPStack_140;
    uVar2 = local_150._8_8_;
    if ((PromiseArena *)local_150._8_8_ != (PromiseArena *)0x0) {
      local_150._8_8_ = (PromiseArena *)0x0;
      pPStack_140 = (PromiseArena *)0x0;
      (*(code *)((pEStack_138->port).ptr)->_vptr_EventPort)(pEStack_138,uVar2,1,pPVar7,pPVar7,0);
    }
  }
  else {
    url_00.content.ptr = *(char **)&pEVar6->firing;
    NetworkAddressHttpClient::openWebSocket((NetworkAddressHttpClient *)this,url_00,headers);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<WebSocketResponse> openWebSocket(
      kj::StringPtr url, const HttpHeaders& headers) override {
    KJ_IF_SOME(c, client) {
      return c->openWebSocket(url, headers);
    } else {
      auto urlCopy = kj::str(url);
      auto headersCopy = headers.clone();
      return promise.addBranch().then(
          [this,url=kj::mv(urlCopy),headers=kj::mv(headersCopy)]() {
        return KJ_ASSERT_NONNULL(client)->openWebSocket(url, headers);
      });
    }